

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O1

void absl::anon_unknown_2::WritePadding(ostream *o,size_t pad)

{
  _func_int *p_Var1;
  undefined4 uVar2;
  code cVar3;
  ulong uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 auVar5 [16];
  char fill_buf [32];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  p_Var1 = (_func_int *)((long)&o->_vptr_basic_ostream + (long)o->_vptr_basic_ostream[-3]);
  if ((&o->field_0xe1)[(long)o->_vptr_basic_ostream[-3]] == '\0') {
    cVar3 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = cVar3;
    p_Var1[0xe1] = (code)0x1;
  }
  uVar2 = *(undefined4 *)(p_Var1 + 0xe0);
  uVar8 = (undefined1)((uint)uVar2 >> 0x18);
  uVar7 = (undefined1)((uint)uVar2 >> 0x10);
  uVar6 = (undefined1)((uint)uVar2 >> 8);
  auVar5._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar8,uVar8),uVar7),CONCAT14(uVar7,uVar2)) >> 0x20
                      );
  auVar5[3] = uVar6;
  auVar5[2] = uVar6;
  auVar5[0] = (undefined1)uVar2;
  auVar5[1] = auVar5[0];
  auVar5._8_8_ = 0;
  auVar5 = pshuflw(auVar5,auVar5,0);
  local_48 = auVar5._0_4_;
  uStack_44 = local_48;
  uStack_40 = local_48;
  uStack_3c = local_48;
  local_38 = local_48;
  uStack_34 = local_48;
  uStack_30 = local_48;
  uStack_2c = local_48;
  if (pad != 0) {
    do {
      uVar4 = 0x20;
      if (pad < 0x20) {
        uVar4 = pad;
      }
      std::ostream::write((char *)o,(long)&local_48);
      pad = pad - uVar4;
    } while (pad != 0);
  }
  return;
}

Assistant:

void WritePadding(std::ostream& o, size_t pad) {
  char fill_buf[32];
  memset(fill_buf, o.fill(), sizeof(fill_buf));
  while (pad) {
    size_t n = std::min(pad, sizeof(fill_buf));
    o.write(fill_buf, n);
    pad -= n;
  }
}